

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

isminetype __thiscall wallet::CWallet::IsMine(CWallet *this,CTxDestination *dest)

{
  isminetype iVar1;
  long in_FS_OFFSET;
  prevector<28U,_unsigned_char,_unsigned_int,_int> pStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)&pStack_38,dest);
  iVar1 = IsMine(this,(CScript *)&pStack_38);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&pStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

isminetype CWallet::IsMine(const CTxDestination& dest) const
{
    AssertLockHeld(cs_wallet);
    return IsMine(GetScriptForDestination(dest));
}